

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<
          (ChArchiveOut *this,
          ChNameValue<std::vector<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>_>
          *bVal)

{
  ChNameValue<std::vector<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>_>
  local_28;
  
  local_28._name = bVal->_name;
  local_28._value = bVal->_value;
  local_28._flags = bVal->_flags;
  out<std::shared_ptr<chrono::ChNodeSPH>>(this,&local_28);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }